

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_createtable(lua_State *L,int narray,int nrec)

{
  undefined4 *puVar1;
  GCtab *pGVar2;
  ulong uVar3;
  int in_EDX;
  long in_RDI;
  GCtab *t;
  uint32_t in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int iVar4;
  
  if (*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x24) <=
      *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x20)) {
    lj_gc_step((lua_State *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  if (in_EDX == 0) {
    iVar4 = 0;
  }
  else if (in_EDX == 1) {
    iVar4 = 1;
    in_stack_ffffffffffffff9c = iVar4;
  }
  else {
    iVar4 = 0x1f;
    if (in_EDX - 1U != 0) {
      for (; in_EDX - 1U >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    iVar4 = iVar4 + 1;
    in_stack_ffffffffffffff9c = iVar4;
  }
  pGVar2 = lj_tab_new((lua_State *)CONCAT44(in_stack_ffffffffffffff9c,iVar4),
                      in_stack_ffffffffffffff94,in_stack_ffffffffffffff90);
  puVar1 = *(undefined4 **)(in_RDI + 0x18);
  *puVar1 = (int)pGVar2;
  puVar1[1] = 0xfffffff4;
  uVar3 = *(long *)(in_RDI + 0x18) + 8;
  *(ulong *)(in_RDI + 0x18) = uVar3;
  if (*(uint *)(in_RDI + 0x20) <= uVar3) {
    lj_state_growstack1((lua_State *)0x114f0e);
  }
  return;
}

Assistant:

LUA_API void lua_createtable(lua_State *L, int narray, int nrec)
{
  GCtab *t;
  lj_gc_check(L);
  t = lj_tab_new(L, (uint32_t)(narray > 0 ? narray+1 : 0), hsize2hbits(nrec));
  settabV(L, L->top, t);
  incr_top(L);
}